

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O0

uint RDL_countURFs(RDL_URFinfo *uInfo)

{
  bool bVar1;
  void *__ptr;
  void *pvVar2;
  char increase;
  char **alreadyInURF;
  uint j;
  uint i;
  uint weightIdx;
  uint URFRelCount;
  RDL_URFinfo *uInfo_local;
  
  i = 0;
  __ptr = malloc((ulong)uInfo->nofWeights << 3);
  for (alreadyInURF._4_4_ = 0; alreadyInURF._4_4_ < uInfo->nofWeights;
      alreadyInURF._4_4_ = alreadyInURF._4_4_ + 1) {
    pvVar2 = malloc((ulong)uInfo->nofProtos[alreadyInURF._4_4_]);
    *(void **)((long)__ptr + (ulong)alreadyInURF._4_4_ * 8) = pvVar2;
  }
  for (alreadyInURF._4_4_ = 0; alreadyInURF._4_4_ < uInfo->nofWeights;
      alreadyInURF._4_4_ = alreadyInURF._4_4_ + 1) {
    for (alreadyInURF._0_4_ = 0; (uint)alreadyInURF < uInfo->nofProtos[alreadyInURF._4_4_];
        alreadyInURF._0_4_ = (uint)alreadyInURF + 1) {
      *(undefined1 *)
       (*(long *)((long)__ptr + (ulong)alreadyInURF._4_4_ * 8) + (ulong)(uint)alreadyInURF) = 0;
    }
  }
  for (j = 0; j < uInfo->nofWeights; j = j + 1) {
    for (alreadyInURF._4_4_ = 0; alreadyInURF._4_4_ < uInfo->nofProtos[j];
        alreadyInURF._4_4_ = alreadyInURF._4_4_ + 1) {
      if ((*(char *)(*(long *)((long)__ptr + (ulong)j * 8) + (ulong)alreadyInURF._4_4_) != '\x01')
         && (uInfo->URFrel[j][alreadyInURF._4_4_][alreadyInURF._4_4_] != '\0')) {
        bVar1 = false;
        for (alreadyInURF._0_4_ = alreadyInURF._4_4_; (uint)alreadyInURF < uInfo->nofProtos[j];
            alreadyInURF._0_4_ = (uint)alreadyInURF + 1) {
          if ((uInfo->URFrel[j][alreadyInURF._4_4_][(uint)alreadyInURF] == '\x01') &&
             (*(undefined1 *)(*(long *)((long)__ptr + (ulong)j * 8) + (ulong)(uint)alreadyInURF) = 1
             , !bVar1)) {
            i = i + 1;
            bVar1 = true;
          }
        }
      }
    }
  }
  for (alreadyInURF._4_4_ = 0; alreadyInURF._4_4_ < uInfo->nofWeights;
      alreadyInURF._4_4_ = alreadyInURF._4_4_ + 1) {
    free(*(void **)((long)__ptr + (ulong)alreadyInURF._4_4_ * 8));
  }
  free(__ptr);
  return i;
}

Assistant:

unsigned RDL_countURFs(RDL_URFinfo *uInfo)
{
  unsigned URFRelCount=0, weightIdx, i, j;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/
  char increase;

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  /*count number of 1s indicating URF-relation*/
  for(weightIdx=0; weightIdx<uInfo->nofWeights; ++weightIdx)
  {
    for(i=0; i<uInfo->nofProtos[weightIdx]; ++i)
    {
      if(alreadyInURF[weightIdx][i] == 1 || uInfo->URFrel[weightIdx][i][i] == 0)
      {
        continue;
      }
      increase = 0;
      for(j=i; j<uInfo->nofProtos[weightIdx]; ++j)
      {
        if(uInfo->URFrel[weightIdx][i][j] == 1)
        {
          alreadyInURF[weightIdx][j] = 1;
          if(increase == 0)
          {
            ++URFRelCount;
            increase = 1;
          }
        }
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  return URFRelCount;
}